

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_worker_ctor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  BOOL BVar1;
  JSAtom atom;
  int iVar2;
  JSRuntime *rt;
  char *pcVar3;
  char *__s;
  undefined8 *__arg;
  char *pcVar4;
  JSWorkerMessagePipe *pJVar5;
  JSValueUnion JVar6;
  JSValueUnion JVar7;
  ulong uVar8;
  JSValue v;
  JSValue JVar9;
  pthread_t tid;
  pthread_attr_t attr;
  
  rt = JS_GetRuntime(ctx);
  BVar1 = is_main_thread(rt);
  if (BVar1 == 0) {
    pcVar3 = "cannot create a worker inside a worker";
LAB_0010fab1:
    v = JS_ThrowTypeError(ctx,pcVar3);
    JVar6 = v.u;
    JVar7.float64 = -NAN;
  }
  else {
    atom = JS_GetScriptOrModuleName(ctx,1);
    if (atom == 0) {
      pcVar3 = "could not determine calling script or module name";
      goto LAB_0010fab1;
    }
    pcVar3 = JS_AtomToCString(ctx,atom);
    JS_FreeAtom(ctx,atom);
    if (pcVar3 == (char *)0x0) {
LAB_0010faa0:
      __s = (char *)0x0;
      v = (JSValue)(ZEXT816(3) << 0x40);
      __arg = (undefined8 *)0x0;
LAB_0010fadb:
      JS_FreeCString(ctx,pcVar3);
      JS_FreeCString(ctx,__s);
      if (__arg != (undefined8 *)0x0) {
        free((void *)*__arg);
        free((void *)__arg[1]);
        js_free_message_pipe((JSWorkerMessagePipe *)__arg[2]);
        js_free_message_pipe((JSWorkerMessagePipe *)__arg[3]);
        free(__arg);
      }
      JS_FreeValue(ctx,v);
      v = (JSValue)(ZEXT816(6) << 0x40);
      uVar8 = 0;
      goto LAB_0010fb3b;
    }
    __s = JS_ToCString(ctx,*argv);
    if (__s == (char *)0x0) goto LAB_0010faa0;
    __arg = (undefined8 *)calloc(1,0x20);
    if (__arg == (undefined8 *)0x0) {
LAB_0010fad0:
      JS_ThrowOutOfMemory(ctx);
      v = (JSValue)(ZEXT816(3) << 0x40);
      goto LAB_0010fadb;
    }
    pcVar4 = strdup(__s);
    *__arg = pcVar4;
    pcVar4 = strdup(pcVar3);
    __arg[1] = pcVar4;
    pJVar5 = js_new_message_pipe();
    __arg[2] = pJVar5;
    if (pJVar5 == (JSWorkerMessagePipe *)0x0) goto LAB_0010fad0;
    pJVar5 = js_new_message_pipe();
    __arg[3] = pJVar5;
    if (pJVar5 == (JSWorkerMessagePipe *)0x0) goto LAB_0010fad0;
    v = js_worker_ctor_internal(ctx,new_target,pJVar5,(JSWorkerMessagePipe *)__arg[2]);
    JVar7 = v.u;
    if ((int)v.tag == 6) goto LAB_0010fadb;
    pthread_attr_init((pthread_attr_t *)&attr);
    pthread_attr_setdetachstate((pthread_attr_t *)&attr,1);
    iVar2 = pthread_create(&tid,(pthread_attr_t *)&attr,worker_func,__arg);
    pthread_attr_destroy((pthread_attr_t *)&attr);
    if (iVar2 != 0) {
      JS_ThrowTypeError(ctx,"could not create worker");
      goto LAB_0010fadb;
    }
    JS_FreeCString(ctx,pcVar3);
    JS_FreeCString(ctx,__s);
    JVar6.float64 = -NAN;
  }
  uVar8 = (ulong)JVar7.ptr & (ulong)JVar6.ptr;
LAB_0010fb3b:
  JVar9.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | uVar8);
  JVar9.tag = v.tag;
  return JVar9;
}

Assistant:

static JSValue js_worker_ctor(JSContext *ctx, JSValueConst new_target,
                              int argc, JSValueConst *argv)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    WorkerFuncArgs *args = NULL;
    pthread_t tid;
    pthread_attr_t attr;
    JSValue obj = JS_UNDEFINED;
    int ret;
    const char *filename = NULL, *basename;
    JSAtom basename_atom;
    
    /* XXX: in order to avoid problems with resource liberation, we
       don't support creating workers inside workers */
    if (!is_main_thread(rt))
        return JS_ThrowTypeError(ctx, "cannot create a worker inside a worker");

    /* base name, assuming the calling function is a normal JS
       function */
    basename_atom = JS_GetScriptOrModuleName(ctx, 1);
    if (basename_atom == JS_ATOM_NULL) {
        return JS_ThrowTypeError(ctx, "could not determine calling script or module name");
    }
    basename = JS_AtomToCString(ctx, basename_atom);
    JS_FreeAtom(ctx, basename_atom);
    if (!basename)
        goto fail;
    
    /* module name */
    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        goto fail;

    args = malloc(sizeof(*args));
    if (!args)
        goto oom_fail;
    memset(args, 0, sizeof(*args));
    args->filename = strdup(filename);
    args->basename = strdup(basename);

    /* ports */
    args->recv_pipe = js_new_message_pipe();
    if (!args->recv_pipe)
        goto oom_fail;
    args->send_pipe = js_new_message_pipe();
    if (!args->send_pipe)
        goto oom_fail;

    obj = js_worker_ctor_internal(ctx, new_target,
                                  args->send_pipe, args->recv_pipe);
    if (JS_IsException(obj))
        goto fail;
    
    pthread_attr_init(&attr);
    /* no join at the end */
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_DETACHED);
    ret = pthread_create(&tid, &attr, worker_func, args);
    pthread_attr_destroy(&attr);
    if (ret != 0) {
        JS_ThrowTypeError(ctx, "could not create worker");
        goto fail;
    }
    JS_FreeCString(ctx, basename);
    JS_FreeCString(ctx, filename);
    return obj;
 oom_fail:
    JS_ThrowOutOfMemory(ctx);
 fail:
    JS_FreeCString(ctx, basename);
    JS_FreeCString(ctx, filename);
    if (args) {
        free(args->filename);
        free(args->basename);
        js_free_message_pipe(args->recv_pipe);
        js_free_message_pipe(args->send_pipe);
        free(args);
    }
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}